

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall crnlib::sparse_bit_array::resize(sparse_bit_array *this,uint size)

{
  uint uVar1;
  uint32 **ppuVar2;
  uint32 *p;
  uint i;
  uint n;
  undefined1 local_28 [8];
  sparse_bit_array temp;
  uint num_groups;
  uint size_local;
  sparse_bit_array *this_local;
  
  temp.m_ppGroups._0_4_ = size + 0x1ff >> 9;
  if ((uint)temp.m_ppGroups != this->m_num_groups) {
    temp.m_ppGroups._4_4_ = size;
    if ((uint)temp.m_ppGroups == 0) {
      clear(this);
    }
    else {
      sparse_bit_array((sparse_bit_array *)local_28);
      swap((sparse_bit_array *)local_28,this);
      this->m_num_groups = (uint)temp.m_ppGroups;
      ppuVar2 = (uint32 **)crnlib_calloc((ulong)this->m_num_groups,8,(size_t *)0x0);
      this->m_ppGroups = ppuVar2;
      if (this->m_ppGroups == (uint32 **)0x0) {
        crnlib_assert("m_ppGroups",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                      ,0x15d);
      }
      uVar1 = math::minimum<unsigned_int>(local_28._0_4_,this->m_num_groups);
      for (p._4_4_ = 0; p._4_4_ < uVar1; p._4_4_ = p._4_4_ + 1) {
        if (*(long *)(temp._0_8_ + (ulong)p._4_4_ * 8) != 0) {
          this->m_ppGroups[p._4_4_] = *(uint32 **)(temp._0_8_ + (ulong)p._4_4_ * 8);
          *(undefined8 *)(temp._0_8_ + (ulong)p._4_4_ * 8) = 0;
        }
      }
      ~sparse_bit_array((sparse_bit_array *)local_28);
    }
  }
  return;
}

Assistant:

void sparse_bit_array::resize(uint size)
    {
        uint num_groups = (size + cBitsPerGroup - 1) >> cBitsPerGroupShift;
        if (num_groups == m_num_groups)
        {
            return;
        }

        if (!num_groups)
        {
            clear();
            return;
        }

        sparse_bit_array temp;
        temp.swap(*this);

        m_num_groups = num_groups;
        m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
        CRNLIB_VERIFY(m_ppGroups);

        uint n = math::minimum(temp.m_num_groups, m_num_groups);
        for (uint i = 0; i < n; i++)
        {
            uint32* p = temp.m_ppGroups[i];
            if (p)
            {
                m_ppGroups[i] = temp.m_ppGroups[i];
                temp.m_ppGroups[i] = nullptr;
            }
        }
    }